

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<n_e_s::core::INesController::Button> * __thiscall
testing::internal::MatcherBase<n_e_s::core::INesController::Button>::operator=
          (MatcherBase<n_e_s::core::INesController::Button> *this,
          MatcherBase<n_e_s::core::INesController::Button> *other)

{
  MatcherBase<n_e_s::core::INesController::Button> *other_local;
  MatcherBase<n_e_s::core::INesController::Button> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }